

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_CMNO_MultipleSuccessfullJobsPass_Test::TestBody
          (InterpreterTestSuite_CMNO_MultipleSuccessfullJobsPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  undefined8 *puVar4;
  element_type *peVar5;
  Registry *this_01;
  bool bVar6;
  CommissionerAppMock *pCVar7;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar8;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar9;
  char *pcVar10;
  long lVar11;
  char *expected_predicate_value;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_4ea;
  Status local_4e9;
  _Any_data local_4e8;
  undefined1 local_4d8 [16];
  _Any_data local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  _Any_data local_4a8;
  undefined1 local_498 [16];
  _Any_data local_488;
  code *local_478;
  code *pcStack_470;
  undefined1 local_460 [8];
  undefined **local_458;
  undefined1 local_450 [8];
  undefined1 local_448 [16];
  _Alloc_hider local_438;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  element_type local_428 [2];
  uint8_t camIdx;
  undefined8 *local_410;
  CommissionerAppMockPtr commissionerAppMocks [2];
  Matcher<const_ot::commissioner::Config_&> local_3e8;
  string local_3c8;
  ByteArray local_3a8;
  string local_390;
  State local_370;
  State local_36c;
  UnixTime local_368;
  UnixTime local_360;
  Value value;
  _Alloc_hider local_310;
  Error local_1d8;
  Error local_1b0;
  Error local_188;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  this_01 = ctx.mRegistry;
  local_460 = (undefined1  [8])local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"127.0.0.1","");
  local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
       (_func_int **)0x0;
  local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
  local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4a8._M_unused._M_object = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_36c,0,0,0,0,0);
  local_4c8._M_unused._M_object = &local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"net1","");
  local_4e8._M_unused._M_object = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
  commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(commissionerAppMocks + 1);
  std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"");
  local_488._M_unused._M_object = &local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"domain1","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  pcVar10 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"","");
  ot::commissioner::UnixTime::UnixTime(&local_360,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&value,(string *)local_460,0x4e21,(ByteArray *)&local_3e8,
             (string *)&local_4a8,local_36c,(string *)&local_4c8,1,(string *)&local_4e8,
             (string *)commissionerAppMocks,(Timestamp)0x0,0,(string *)&local_488,&local_3a8,
             &local_3c8,'\0',0,&local_390,local_360,0x103f);
  local_4e9 = ot::commissioner::persistent_storage::Registry::Add(this_01,(BorderAgent *)&value);
  local_4ea = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&camIdx,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_4e9,&local_4ea);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((code **)local_488._M_unused._0_8_ != &local_478) {
    operator_delete(local_488._M_unused._M_object);
  }
  if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
    operator_delete(commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4e8._M_unused._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4d8) {
    operator_delete(local_4e8._M_unused._M_object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_unused._0_8_ != &local_4b8) {
    operator_delete(local_4c8._M_unused._M_object);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8._M_unused._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_498) {
    operator_delete(local_4a8._M_unused._M_object);
  }
  if (local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
      (_func_int **)0x0) {
    operator_delete(local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase)
    ;
  }
  if (local_460 != (undefined1  [8])local_450) {
    operator_delete((void *)local_460);
  }
  puVar4 = local_410;
  if (camIdx == '\0') {
    testing::Message::Message((Message *)&value);
    if (local_410 != (undefined8 *)0x0) {
      pcVar10 = (char *)*local_410;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_460,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x305,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_460,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_460);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
    if (local_410 == (undefined8 *)0x0) goto LAB_00159340;
    if ((undefined8 *)*local_410 != local_410 + 2) {
      operator_delete((undefined8 *)*local_410);
    }
  }
  else {
    if (local_410 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_410 != local_410 + 2) {
        operator_delete((undefined8 *)*local_410);
      }
      operator_delete(puVar4);
    }
    local_460 = (undefined1  [8])local_450;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"127.0.0.2","");
    local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)0x0;
    local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
    local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_4a8._M_unused._M_object = local_498;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_370,0,0,0,0,0);
    local_4c8._M_unused._M_object = &local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"net2","");
    local_4e8._M_unused._M_object = local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
    commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(commissionerAppMocks + 1);
    std::__cxx11::string::_M_construct<char_const*>((string *)commissionerAppMocks,"");
    local_488._M_unused._M_object = &local_478;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"domain2","");
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    pcVar10 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"","");
    ot::commissioner::UnixTime::UnixTime(&local_368,0);
    expected_predicate_value = (char *)(ulong)(uint)local_370;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)local_460,0x4e21,(ByteArray *)&local_3e8,
               (string *)&local_4a8,local_370,(string *)&local_4c8,2,(string *)&local_4e8,
               (string *)commissionerAppMocks,(Timestamp)0x0,0,(string *)&local_488,&local_3a8,
               &local_3c8,'\0',0,&local_390,local_368,0x103f);
    local_4e9 = ot::commissioner::persistent_storage::Registry::Add
                          (ctx.mRegistry,(BorderAgent *)&value);
    local_4ea = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&camIdx,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_4e9,&local_4ea);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((code **)local_488._M_unused._0_8_ != &local_478) {
      operator_delete(local_488._M_unused._M_object);
    }
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)(commissionerAppMocks + 1)) {
      operator_delete(commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4e8._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4d8) {
      operator_delete(local_4e8._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != &local_4b8) {
      operator_delete(local_4c8._M_unused._M_object);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8._M_unused._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_498) {
      operator_delete(local_4a8._M_unused._M_object);
    }
    if (local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      operator_delete(local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.
                      _vptr_MatcherBase);
    }
    if (local_460 != (undefined1  [8])local_450) {
      operator_delete((void *)local_460);
    }
    if (camIdx != '\0') {
      if (local_410 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_410 != local_410 + 2) {
          operator_delete((undefined8 *)*local_410);
        }
        operator_delete(local_410);
      }
      camIdx = '\0';
      pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar7,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar7);
      commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pCVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                (&commissionerAppMocks[0].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pCVar7);
      pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar7,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar7);
      commissionerAppMocks[1].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pCVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                (&commissionerAppMocks[1].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pCVar7);
      local_390._M_string_length = (size_type)operator_new(8);
      (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
       local_390._M_string_length)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface
           = (_func_int **)&PTR__MatcherDescriberInterface_0039a928;
      local_390._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_390.field_2._M_allocated_capacity,
                 (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                 local_390._M_string_length);
      local_390._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395cd8;
      local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(8);
      ((local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_0039a9e0;
      local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)&PTR__MatcherBase_00395d88;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                (&local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)&PTR__MatcherBase_00395d40;
      CommissionerAppStaticExpecter::gmock_Create
                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)local_460,&ctx.mCommissionerAppStaticExpecter,
                 (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_390,
                 &local_3e8);
      testing::internal::GetWithoutMatchers();
      pTVar8 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               ::InternalExpectedAt
                         ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                           *)local_460,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x30f,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      pTVar8 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               ::Times(pTVar8,2);
      paVar1 = &local_188.mMessage.field_2;
      local_188.mCode = kNone;
      local_188.mMessage._M_string_length = 0;
      local_188.mMessage.field_2._M_local_buf[0] = '\0';
      local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
      testing::Return<ot::commissioner::Error>((testing *)&local_3a8,&local_188);
      local_3c8._M_dataplus._M_p =
           (pointer)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_3c8._M_string_length =
           (size_type)
           local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 8) =
               *(_Atomic_word *)
                ((long)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 8) =
               *(_Atomic_word *)
                ((long)local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        }
      }
      local_4a8._M_unused._M_object = commissionerAppMocks;
      local_498._0_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:786:30)>
           ::_M_manager;
      local_498._8_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:786:30)>
           ::_M_invoke;
      local_4a8._8_8_ = (internal *)&camIdx;
      local_3c8.field_2._M_allocated_capacity = (size_type)local_4a8._M_unused._M_object;
      local_3c8.field_2._8_8_ = (internal *)&camIdx;
      std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)&local_4c8
                 ,(function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                  &local_4a8);
      local_4d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4d8._8_8_ = 0;
      local_4e8._M_unused._M_object = (pointer)0x0;
      local_4e8._8_8_ = 0;
      local_4e8._M_unused._M_object = operator_new(0x20);
      *(undefined8 *)local_4e8._M_unused._0_8_ = 0;
      *(undefined8 *)((long)local_4e8._M_unused._0_8_ + 8) = 0;
      *(undefined8 *)((long)local_4e8._M_unused._0_8_ + 0x10) = 0;
      *(undefined8 *)((long)local_4e8._M_unused._0_8_ + 0x18) = local_4b8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined4 *)local_4e8._M_unused._0_8_ = local_4c8._0_4_;
        *(undefined4 *)((long)local_4e8._M_unused._0_8_ + 4) = local_4c8._4_4_;
        *(undefined4 *)((long)local_4e8._M_unused._0_8_ + 8) = local_4c8._8_4_;
        *(undefined4 *)((long)local_4e8._M_unused._0_8_ + 0xc) = local_4c8._12_4_;
        *(size_type *)((long)local_4e8._M_unused._0_8_ + 0x10) = local_4b8._M_allocated_capacity;
      }
      local_4e8._8_8_ = 0;
      local_4d8._0_8_ = std::_Function_handler::operator_cast_to_Action;
      local_4d8._8_8_ = std::_Function_handler::operator_cast_to_Action;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(code *)local_498._0_8_)(&local_4a8,&local_4a8,3);
      }
      __l._M_len = 1;
      __l._M_array = (iterator)&local_4e8;
      std::
      vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
      ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                *)&value,__l,(allocator_type *)&local_4a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(code *)local_4d8._0_8_)(&local_4e8,&local_4e8,3);
      }
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)&value.mError.mMessage.field_2,(ReturnAction *)&local_3c8);
      local_478 = (code *)0x0;
      pcStack_470 = (code *)0x0;
      local_488._M_unused._M_object = (void *)0x0;
      local_488._8_8_ = 0;
      local_488._M_unused._M_object = operator_new(0x38);
      *(undefined8 *)local_488._M_unused._0_8_ = value.mError._0_8_;
      *(pointer *)((long)local_488._M_unused._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
      *(size_type *)((long)local_488._M_unused._0_8_ + 0x10) =
           value.mError.mMessage._M_string_length;
      value.mError.mMessage._M_string_length = 0;
      value.mError.mCode = kNone;
      value.mError._4_4_ = 0;
      value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
      *(code **)((long)local_488._M_unused._0_8_ + 0x28) = (code *)0x0;
      *(code **)((long)local_488._M_unused._0_8_ + 0x18) = (code *)0x0;
      *(code **)((long)local_488._M_unused._0_8_ + 0x20) = (code *)0x0;
      *(size_type *)((long)local_488._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
      if (value.mData._M_dataplus._M_p != (pointer)0x0) {
        *(code **)((long)local_488._M_unused._0_8_ + 0x18) =
             (code *)CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                              value.mError.mMessage.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_488._M_unused._0_8_ + 0x20) =
             value.mError.mMessage.field_2._8_8_;
        *(pointer *)((long)local_488._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
        value.mData._M_dataplus._M_p = (pointer)0x0;
        value.mData._M_string_length = 0;
      }
      local_488._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478 = std::_Function_handler::operator_cast_to_Action;
      pcStack_470 = std::_Function_handler::operator_cast_to_Action;
      std::
      vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
      ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                 *)&value);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillRepeatedly(pTVar8,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                               *)&local_488);
      if (local_478 != (code *)0x0) {
        (*local_478)(&local_488,&local_488,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(local_188.mMessage._M_dataplus._M_p);
      }
      local_448._8_8_ = &PTR__MatcherBase_00395d20;
      if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430._M_pi);
      }
      local_458 = &PTR__MatcherBase_00395d88;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._0_8_);
      }
      local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)&PTR__MatcherBase_00395d88;
      if (local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
          super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3e8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                   super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_390._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_390.field_2._M_allocated_capacity);
      }
      peVar5 = commissionerAppMocks[0].
               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_4a8._8_8_ = operator_new(8);
      (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)local_4a8._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_003994f0;
      local_4a8._M_unused._M_object = &PTR__MatcherBase_00396e08;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_498,
                 (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_4a8._8_8_);
      local_4a8._M_unused._M_object = &PTR__MatcherBase_00396dc0;
      local_4c8._8_8_ = operator_new(8);
      (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)local_4c8._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_003995b8;
      local_4c8._M_unused._M_object = &PTR__MatcherBase_003968b0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4b8._M_allocated_capacity,
                 (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_4c8._8_8_);
      local_4c8._M_unused._M_object = &PTR__MatcherBase_00396868;
      local_4e8._8_8_ = operator_new(8);
      (((MatcherInterface<const_unsigned_short_&> *)local_4e8._8_8_)->
      super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_00399670;
      local_4e8._M_unused._M_object = &PTR__MatcherBase_00396a78;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4d8,
                 (MatcherInterface<const_unsigned_short_&> *)local_4e8._8_8_);
      local_4e8._M_unused._M_object = &PTR__MatcherBase_00396a30;
      CommissionerAppMock::gmock_Start
                ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)&value,peVar5,
                 (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_4a8,
                 (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_4c8,(Matcher<unsigned_short> *)&local_4e8);
      testing::internal::GetWithoutMatchers();
      pTVar9 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::InternalExpectedAt
                         ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                           *)&value,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x314,"*commissionerAppMocks[0]","Start(_, _, _)");
      pTVar9 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::Times(pTVar9,1);
      paVar1 = &local_1b0.mMessage.field_2;
      local_1b0.mCode = kNone;
      local_1b0.mMessage._M_string_length = 0;
      local_1b0.mMessage.field_2._M_local_buf[0] = '\0';
      local_1b0.mMessage._M_dataplus._M_p = (pointer)paVar1;
      testing::Return<ot::commissioner::Error>((testing *)local_488._M_pod_data,&local_1b0);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_460,(ReturnAction *)local_488._M_pod_data);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(pTVar9,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                         *)local_460);
      if (local_450 != (undefined1  [8])0x0) {
        (*(code *)local_450)(local_460,local_460,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0.mMessage._M_dataplus._M_p);
      }
      value.mData.field_2._M_allocated_capacity = (size_type)&PTR__MatcherBase_00396e08;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_p);
      }
      value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_003968b0;
      if (value.mData._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value.mData._M_string_length);
      }
      value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                   value.mError.mMessage.field_2._M_local_buf[0]) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                            value.mError.mMessage.field_2._M_local_buf[0]));
      }
      local_4e8._M_unused._M_object = &PTR__MatcherBase_00396a78;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._0_8_);
      }
      local_4c8._M_unused._M_object = &PTR__MatcherBase_003968b0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._M_allocated_capacity);
      }
      local_4a8._M_unused._M_object = &PTR__MatcherBase_00396e08;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._0_8_);
      }
      peVar5 = commissionerAppMocks[1].
               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_4a8._8_8_ = operator_new(8);
      (((MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)local_4a8._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_003994f0;
      local_4a8._M_unused._M_object = &PTR__MatcherBase_00396e08;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<std::__cxx11::string&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_498,
                 (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_4a8._8_8_);
      local_4a8._M_unused._M_object = &PTR__MatcherBase_00396dc0;
      local_4c8._8_8_ = operator_new(8);
      (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)local_4c8._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_003995b8;
      local_4c8._M_unused._M_object = &PTR__MatcherBase_003968b0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4b8._M_allocated_capacity,
                 (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_4c8._8_8_);
      local_4c8._M_unused._M_object = &PTR__MatcherBase_00396868;
      local_4e8._8_8_ = operator_new(8);
      (((MatcherInterface<const_unsigned_short_&> *)local_4e8._8_8_)->
      super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_00399670;
      local_4e8._M_unused._M_object = &PTR__MatcherBase_00396a78;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4d8,
                 (MatcherInterface<const_unsigned_short_&> *)local_4e8._8_8_);
      local_4e8._M_unused._M_object = &PTR__MatcherBase_00396a30;
      CommissionerAppMock::gmock_Start
                ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)&value,peVar5,
                 (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_4a8,
                 (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_4c8,(Matcher<unsigned_short> *)&local_4e8);
      testing::internal::GetWithoutMatchers();
      pTVar9 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::InternalExpectedAt
                         ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                           *)&value,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x315,"*commissionerAppMocks[1]","Start(_, _, _)");
      pTVar9 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::Times(pTVar9,1);
      paVar1 = &local_1d8.mMessage.field_2;
      local_1d8.mCode = kNone;
      local_1d8.mMessage._M_string_length = 0;
      local_1d8.mMessage.field_2._M_local_buf[0] = '\0';
      local_1d8.mMessage._M_dataplus._M_p = (pointer)paVar1;
      testing::Return<ot::commissioner::Error>((testing *)local_488._M_pod_data,&local_1d8);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_460,(ReturnAction *)local_488._M_pod_data);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(pTVar9,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                         *)local_460);
      if (local_450 != (undefined1  [8])0x0) {
        (*(code *)local_450)(local_460,local_460,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8.mMessage._M_dataplus._M_p);
      }
      value.mData.field_2._M_allocated_capacity = (size_type)&PTR__MatcherBase_00396e08;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_p);
      }
      value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_003968b0;
      if (value.mData._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value.mData._M_string_length);
      }
      value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                   value.mError.mMessage.field_2._M_local_buf[0]) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                            value.mError.mMessage.field_2._M_local_buf[0]));
      }
      local_4e8._M_unused._M_object = &PTR__MatcherBase_00396a78;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._0_8_);
      }
      local_4c8._M_unused._M_object = &PTR__MatcherBase_003968b0;
      paVar1 = &value.mError.mMessage.field_2;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._M_allocated_capacity);
      }
      local_4a8._M_unused._M_object = &PTR__MatcherBase_00396e08;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._0_8_);
      }
      local_4b8._M_allocated_capacity = 0;
      local_4c8._M_unused._M_object = (pointer)0x0;
      local_4c8._8_8_ = 0;
      paVar2 = &value.mData.field_2;
      value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
      value.mError.mMessage._M_string_length = 0;
      value.mError.mMessage.field_2._M_local_buf[0] = '\0';
      value.mData._M_string_length = 0;
      value.mData.field_2._M_allocated_capacity =
           value.mData.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_460 = (undefined1  [8])local_450;
      value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
      value.mData._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_460,"start --nwk net1 net2","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&local_4e8,&ctx.mInterpreter,(string *)local_460);
      local_498._0_8_ = local_4b8._M_allocated_capacity;
      local_4a8._8_8_ = local_4c8._8_8_;
      local_4a8._M_unused._0_8_ = local_4c8._M_unused._0_8_;
      local_4b8._M_allocated_capacity = local_4d8._0_8_;
      local_4c8._M_unused._M_object = local_4e8._M_unused._M_object;
      local_4c8._8_8_ = local_4e8._8_8_;
      local_4e8._M_unused._M_object = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4e8._8_8_ = 0;
      local_4d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4e8);
      if (local_460 != (undefined1  [8])local_450) {
        operator_delete((void *)local_460);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_460,&ctx.mInterpreter,(Expression *)&local_4c8);
      value.mError.mCode = local_460._0_4_;
      std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_458);
      std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_438);
      if ((element_type *)local_438._M_p != local_428) {
        operator_delete(local_438._M_p);
      }
      if (local_458 != (undefined **)local_448) {
        operator_delete(local_458);
      }
      bVar6 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_4a8._M_pod_data[0] = bVar6;
      local_4a8._8_8_ = (undefined8 *)0x0;
      if (!bVar6) {
        testing::Message::Message((Message *)&local_4e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_460,(internal *)&local_4a8,(AssertionResult *)0x2ddeee,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_488,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x31b,(char *)local_460);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_488,(Message *)&local_4e8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_488);
        if (local_460 != (undefined1  [8])local_450) {
          operator_delete((void *)local_460);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4e8._M_unused._0_8_ !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (**(code **)&(*local_4e8._M_unused._M_object)->_M_use_count)();
        }
        uVar3 = local_4a8._8_8_;
        if ((undefined8 *)local_4a8._8_8_ != (undefined8 *)0x0) {
          if (*(undefined8 **)local_4a8._8_8_ != (undefined8 *)(local_4a8._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_4a8._8_8_);
          }
          operator_delete((void *)uVar3);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value.mData._M_dataplus._M_p != paVar2) {
        operator_delete(value.mData._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(value.mError.mMessage._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4c8);
      lVar11 = 0x20;
      do {
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)commissionerAppMocks + lVar11 + -8);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        lVar11 = lVar11 + -0x10;
      } while (lVar11 != 0);
      goto LAB_00159340;
    }
    testing::Message::Message((Message *)&value);
    if (local_410 != (undefined8 *)0x0) {
      pcVar10 = (char *)*local_410;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_460,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x30a,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_460,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_460);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
    if (local_410 == (undefined8 *)0x0) goto LAB_00159340;
    if ((undefined8 *)*local_410 != local_410 + 2) {
      operator_delete((undefined8 *)*local_410);
    }
  }
  operator_delete(local_410);
LAB_00159340:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, CMNO_MultipleSuccessfullJobsPass)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[2] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(2)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start --nwk net1 net2");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}